

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  future<void> *this;
  runtime_error *e;
  type *D;
  type *C;
  type *B;
  type *A;
  Taskflow taskflow;
  Executor executor;
  nullptr_t in_stack_fffffffffffffd18;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd20;
  Taskflow *f;
  Executor *this_00;
  string *name;
  Taskflow *in_stack_fffffffffffffd40;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd48;
  Executor *in_stack_fffffffffffffd50;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  FlowBuilder *in_stack_fffffffffffffd68;
  allocator<char> local_249;
  string local_248 [80];
  _Elt_pointer in_stack_fffffffffffffe08;
  _Elt_pointer in_stack_fffffffffffffe10;
  Executor *in_stack_fffffffffffffe18;
  string local_150 [10];
  int local_4;
  
  local_4 = 0;
  uVar1 = std::thread::hardware_concurrency();
  this = (future<void> *)(ulong)uVar1;
  name = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  tf::Executor::Executor
            (in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffe08);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10589a);
  this_00 = (Executor *)&local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58,
             (allocator<char> *)in_stack_fffffffffffffd50);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffd40,name);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_exception_cpp:11:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_exception_cpp:12:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_exception_cpp:16:5),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_exception_cpp:20:5),_nullptr>
            (in_stack_fffffffffffffd68,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58,(anon_class_1_0_00000001 *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  f = (Taskflow *)&stack0xfffffffffffffd90;
  std::get<0ul,tf::Task,tf::Task,tf::Task,tf::Task>
            ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x10592f);
  std::get<1ul,tf::Task,tf::Task,tf::Task,tf::Task>
            ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x10593e);
  std::get<2ul,tf::Task,tf::Task,tf::Task,tf::Task>
            ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x10594d);
  std::get<3ul,tf::Task,tf::Task,tf::Task,tf::Task>
            ((tuple<tf::Task,_tf::Task,_tf::Task,_tf::Task> *)0x10595c);
  tf::Task::precede<tf::Task&,tf::Task&>((Task *)this,(Task *)this_00,(Task *)f);
  tf::Task::succeed<tf::Task&,tf::Task&>((Task *)this,(Task *)this_00,(Task *)f);
  tf::Executor::run(this_00,f);
  std::future<void>::get(this);
  tf::Future<void>::~Future((Future<void> *)f);
  local_4 = 0;
  tf::Taskflow::~Taskflow(f);
  tf::Executor::~Executor(in_stack_fffffffffffffd50);
  return local_4;
}

Assistant:

int main(){

  tf::Executor executor;
  tf::Taskflow taskflow("exception");

  auto [A, B, C, D] = taskflow.emplace(
    []() { std::cout << "TaskA\n"; },
    []() { 
      std::cout << "TaskB\n";
      throw std::runtime_error("Exception on Task B");
    },
    []() { 
      std::cout << "TaskC\n"; 
      throw std::runtime_error("Exception on Task C");
    },
    []() { std::cout << "TaskD will not be printed due to exception\n"; }
  );

  A.precede(B, C);  // A runs before B and C
  D.succeed(B, C);  // D runs after  B and C

  try {
    executor.run(taskflow).get();
  }
  catch(const std::runtime_error& e) {
    // catched either TaskB's or TaskC's exception
    std::cout << e.what() << std::endl;
  }

  return 0;
}